

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O1

void __thiscall
Memory::HeapBlockMap32::VerifyMarkCountForPages<2048u>
          (HeapBlockMap32 *this,void *address,uint pageCount)

{
  L2MapChunk *this_00;
  code *pcVar1;
  bool bVar2;
  BVIndex BVar3;
  undefined4 *puVar4;
  BVStatic<256UL> *this_01;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  BVIndex startOffset;
  uint uVar8;
  
  this_00 = this->map[(ulong)address >> 0x14 & 0xfff];
  if (this_00 == (L2MapChunk *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x15e,"(l2map != nullptr)","l2map != nullptr");
    if (!bVar2) goto LAB_006c153f;
    *puVar4 = 0;
  }
  uVar8 = (uint)address >> 0xc;
  uVar5 = uVar8 & 0xff;
  uVar7 = pageCount + uVar5;
  if (0x100 < uVar7) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                       ,0x162,"(id2 + pageCount <= L2Count)","id2 + pageCount <= L2Count");
    if (!bVar2) {
LAB_006c153f:
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  if (uVar5 < uVar7) {
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    uVar8 = uVar8 & 0xff;
    uVar6 = (ulong)uVar8;
    startOffset = uVar8 << 8;
    do {
      this_01 = BVStatic<65536ul>::GetRange<256ul>((BVStatic<65536ul> *)this_00,startOffset);
      BVar3 = BVStatic<256UL>::Count(this_01);
      if (BVar3 != this_00->pageMarkCount[uVar6]) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBlockMap.cpp"
                           ,0x16a,"(markCountForPage == l2map->pageMarkCount[i])",
                           "markCountForPage == l2map->pageMarkCount[i]");
        if (!bVar2) goto LAB_006c153f;
        *puVar4 = 0;
      }
      uVar6 = uVar6 + 1;
      startOffset = startOffset + 0x100;
    } while (uVar7 != uVar6);
  }
  return;
}

Assistant:

void
HeapBlockMap32::VerifyMarkCountForPages(void * address, uint pageCount)
{
    uint id1 = GetLevel1Id(address);

    L2MapChunk * l2map = map[id1];
    Assert(l2map != nullptr);

    uint id2 = GetLevel2Id(address);

    Assert(id2 + pageCount <= L2Count);
    for (uint i = id2; i < pageCount + id2; i++)
    {
        uint markCountForPage = l2map->GetPageMarkBitVector(i)->Count();
#if ENABLE_ALLOCATIONS_DURING_CONCURRENT_SWEEP
        DebugOnly(HeapBlock * heapBlock = this->GetHeapBlock(address));
        Assert(markCountForPage == l2map->pageMarkCount[i] || heapBlock->WasAllocatedFromDuringSweep());
#else
        Assert(markCountForPage == l2map->pageMarkCount[i]);
#endif
    }
}